

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe8At7(uint8_t *buf)

{
  return (ulong)(byte)(*buf << 7 | buf[1] >> 1);
}

Assistant:

std::uint64_t readFlUIntBe8At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 7;
    res |= (buf[1] >> 1);
    res &= UINT64_C(0xff);
    return res;
}